

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

void writeInFile(vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *image,int w,int h,string *name)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ostream *poVar3;
  pointer pVVar4;
  size_t j;
  long lVar5;
  size_t i;
  long lVar6;
  float fVar7;
  float fVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs);
  std::operator+(&local_270,"../images/out",name);
  std::operator+(&local_250,&local_270,".ppm");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  poVar3 = std::operator<<((ostream *)&ofs,"P6\n");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,w);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,h);
  std::operator<<(poVar3,"\n255\n");
  for (lVar6 = 0; lVar6 != h * w; lVar6 = lVar6 + 1) {
    pVVar4 = (image->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar7 = pVVar4[lVar6].z;
    uVar1 = pVVar4[lVar6].x;
    uVar2 = pVVar4[lVar6].y;
    fVar8 = fVar7;
    if (fVar7 <= (float)uVar2) {
      fVar8 = (float)uVar2;
    }
    if (fVar8 <= (float)uVar1) {
      fVar8 = (float)uVar1;
    }
    if (1.0 < fVar8) {
      pVVar4 = pVVar4 + lVar6;
      fVar8 = 1.0 / fVar8;
      pVVar4->x = fVar8 * (float)uVar1;
      pVVar4->y = fVar8 * (float)uVar2;
      pVVar4->z = fVar7 * fVar8;
    }
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      pVVar4 = (image->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      if (lVar5 != 0) {
        if (lVar5 == 1) {
          pVVar4 = (pointer)&pVVar4->y;
        }
        else {
          pVVar4 = (pointer)&pVVar4->z;
        }
      }
      fVar7 = pVVar4->x;
      if (1.0 <= fVar7) {
        fVar7 = 1.0;
      }
      if (fVar7 <= 0.0) {
        fVar7 = 0.0;
      }
      std::operator<<((ostream *)&ofs,(char)(int)(fVar7 * 255.0));
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void writeInFile(std::vector<Vec3f> &image, int w, int h, std::string name){
    std::ofstream ofs;
    ofs.open("../images/out" + name + ".ppm", std::ios::binary);
    ofs << "P6\n" << w << " " << h << "\n255\n";
    for(size_t i = 0; i < h * w; i++){
        Vec3f &c = image[i];
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max>1) c = c*(1.f/max);
        for (size_t j = 0; j<3; j++) {
            ofs << (char)(255 * std::max(0.f, std::min(1.f, image[i][j])));
        }
    }
    ofs.close();
}